

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.c
# Opt level: O0

int check_cert(X509_STORE_CTX *ctx)

{
  int iVar1;
  OPENSSL_STACK *st;
  X509_STORE_CTX *ctx_00;
  long in_RDI;
  uint last_reasons;
  X509 *x;
  int cnum;
  int ok;
  X509_CRL *dcrl;
  X509_CRL *crl;
  int iVar2;
  int local_24;
  X509_CRL *local_18;
  long local_10;
  int local_4;
  
  local_18 = (X509_CRL *)0x0;
  local_24 = 0;
  iVar2 = *(int *)(in_RDI + 0xac);
  local_10 = in_RDI;
  st = ossl_check_const_X509_sk_type(*(stack_st_X509 **)(in_RDI + 0x98));
  ctx_00 = (X509_STORE_CTX *)OPENSSL_sk_value(st,iVar2);
  *(X509_STORE_CTX **)(local_10 + 0xb8) = ctx_00;
  *(undefined8 *)(local_10 + 0xc0) = 0;
  *(undefined4 *)(local_10 + 0xd0) = 0;
  *(undefined4 *)(local_10 + 0xd4) = 0;
  if (((ulong)(ctx_00->ex_data).sk & 0x400) == 0) {
    do {
      if (*(int *)(local_10 + 0xd4) == 0x807f) goto LAB_002d5d8d;
      iVar2 = *(int *)(local_10 + 0xd4);
      if (*(long *)(local_10 + 0x58) == 0) {
        local_24 = get_crl_delta(ctx,(X509_CRL **)crl,(X509_CRL **)dcrl,_cnum);
      }
      else {
        local_24 = (**(code **)(local_10 + 0x58))(local_10,&local_18,ctx_00);
      }
      if (local_24 == 0) {
        local_24 = verify_cb_crl(ctx_00,iVar2);
        goto LAB_002d5d8d;
      }
      *(X509_CRL **)(local_10 + 200) = local_18;
      iVar1 = (**(code **)(local_10 + 0x60))(local_10,local_18);
      if (iVar1 == 0) {
        local_24 = 0;
        goto LAB_002d5d8d;
      }
      local_24 = (**(code **)(local_10 + 0x68))(local_10,local_18,ctx_00);
      if (local_24 == 0) goto LAB_002d5d8d;
      X509_CRL_free(local_18);
      X509_CRL_free((X509_CRL *)0x0);
      local_18 = (X509_CRL *)0x0;
    } while (iVar2 != *(int *)(local_10 + 0xd4));
    local_24 = verify_cb_crl(ctx_00,iVar2);
LAB_002d5d8d:
    X509_CRL_free(local_18);
    X509_CRL_free((X509_CRL *)0x0);
    *(undefined8 *)(local_10 + 200) = 0;
    local_4 = local_24;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int check_cert(X509_STORE_CTX *ctx)
{
    X509_CRL *crl = NULL, *dcrl = NULL;
    int ok = 0;
    int cnum = ctx->error_depth;
    X509 *x = sk_X509_value(ctx->chain, cnum);

    ctx->current_cert = x;
    ctx->current_issuer = NULL;
    ctx->current_crl_score = 0;
    ctx->current_reasons = 0;

    if ((x->ex_flags & EXFLAG_PROXY) != 0)
        return 1;

    while (ctx->current_reasons != CRLDP_ALL_REASONS) {
        unsigned int last_reasons = ctx->current_reasons;

        /* Try to retrieve relevant CRL */
        if (ctx->get_crl != NULL)
            ok = ctx->get_crl(ctx, &crl, x);
        else
            ok = get_crl_delta(ctx, &crl, &dcrl, x);
        /* If error looking up CRL, nothing we can do except notify callback */
        if (!ok) {
            ok = verify_cb_crl(ctx, X509_V_ERR_UNABLE_TO_GET_CRL);
            goto done;
        }
        ctx->current_crl = crl;
        ok = ctx->check_crl(ctx, crl);
        if (!ok)
            goto done;

        if (dcrl != NULL) {
            ok = ctx->check_crl(ctx, dcrl);
            if (!ok)
                goto done;
            ok = ctx->cert_crl(ctx, dcrl, x);
            if (!ok)
                goto done;
        } else {
            ok = 1;
        }

        /* Don't look in full CRL if delta reason is removefromCRL */
        if (ok != 2) {
            ok = ctx->cert_crl(ctx, crl, x);
            if (!ok)
                goto done;
        }

        X509_CRL_free(crl);
        X509_CRL_free(dcrl);
        crl = NULL;
        dcrl = NULL;
        /*
         * If reasons not updated we won't get anywhere by another iteration,
         * so exit loop.
         */
        if (last_reasons == ctx->current_reasons) {
            ok = verify_cb_crl(ctx, X509_V_ERR_UNABLE_TO_GET_CRL);
            goto done;
        }
    }
 done:
    X509_CRL_free(crl);
    X509_CRL_free(dcrl);

    ctx->current_crl = NULL;
    return ok;
}